

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O3

void __thiscall
SyncFixture_SyncToBadVersions_Test::TestBody(SyncFixture_SyncToBadVersions_Test *this)

{
  database *db;
  undefined1 *puVar1;
  uint64_t *puVar2;
  AssertHelperData *pAVar3;
  bool bVar4;
  pointer *__ptr;
  transaction_type t1;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_90 [36];
  undefined4 local_6c;
  transaction<std::unique_lock<mock_mutex>_> local_68;
  
  pstore::get_error_category();
  local_6c = 2;
  puVar2 = &local_68.super_transaction_base.size_;
  local_68.super_transaction_base.size_ = 0;
  local_68.super_transaction_base.dbsize_ = 0;
  local_68.super_transaction_base.db_ = (database *)0x0;
  local_68.super_transaction_base._vptr_transaction_base = (_func_int **)puVar2;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    pstore::database::sync(&(this->super_SyncFixture).db_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_68,0,(char *)local_68.super_transaction_base.db_,0x205ddb);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_68.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
  if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8._0_8_ !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 8))();
  }
  if (local_68.super_transaction_base._vptr_transaction_base != (_func_int **)puVar2) {
    operator_delete(local_68.super_transaction_base._vptr_transaction_base,
                    local_68.super_transaction_base.size_ + 1);
  }
  db = &(this->super_SyncFixture).db_;
  puVar1 = &(this->super_SyncFixture).field_0x10;
  local_b8[8] = false;
  local_b8._0_8_ = puVar1;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_b8);
  local_b8[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_68,db,(lock_type *)local_b8);
  local_b8._0_8_ = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a","");
  pAVar3 = (AssertHelperData *)(local_90 + 0x10);
  local_90._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"first value","");
  anon_unknown.dwarf_3c2cca::SyncFixture::add
            (&this->super_SyncFixture,&local_68,(string *)local_b8,(string *)local_90);
  if ((AssertHelperData *)local_90._0_8_ != pAVar3) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit(&local_68.super_transaction_base);
  local_68.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340;
  pstore::transaction_base::rollback(&local_68.super_transaction_base);
  pstore::database::sync(db);
  local_b8[8] = false;
  local_b8._0_8_ = puVar1;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_b8);
  local_b8[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_68,db,(lock_type *)local_b8);
  local_b8._0_8_ = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"b","");
  local_90._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"second value","");
  anon_unknown.dwarf_3c2cca::SyncFixture::add
            (&this->super_SyncFixture,&local_68,(string *)local_b8,(string *)local_90);
  if ((AssertHelperData *)local_90._0_8_ != pAVar3) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit(&local_68.super_transaction_base);
  local_68.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340;
  pstore::transaction_base::rollback(&local_68.super_transaction_base);
  pstore::get_error_category();
  local_6c = 2;
  local_68.super_transaction_base.size_ = 0;
  local_68.super_transaction_base.dbsize_ = 0;
  puVar2 = &local_68.super_transaction_base.size_;
  local_68.super_transaction_base.db_ = (database *)0x0;
  local_68.super_transaction_base._vptr_transaction_base = (_func_int **)puVar2;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    pstore::database::sync(db);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_68,0,(char *)local_68.super_transaction_base.db_,0x205ddb);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_68.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_b8._0_8_ !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(size_type *)local_b8._0_8_ + 8))();
  }
  if (local_68.super_transaction_base._vptr_transaction_base != (_func_int **)puVar2) {
    operator_delete(local_68.super_transaction_base._vptr_transaction_base,
                    local_68.super_transaction_base.size_ + 1);
  }
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}